

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O3

Min_Cube_t * Min_SopComplement(Min_Man_t *p,Min_Cube_t *pSharp)

{
  long lVar1;
  Min_Cube_t **ppMVar2;
  Min_Cube_t **ppMVar3;
  uint *__ptr;
  void *pvVar4;
  Min_Cube_t *pMVar5;
  Min_Cube_t *pMVar6;
  Min_Cube_t *pMVar7;
  uint uVar8;
  ulong uVar9;
  uint *__s;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  Min_Cube_t *pMVar14;
  long lVar15;
  int iVar16;
  Min_Cube_t *pCover;
  undefined1 local_58 [16];
  Min_Cube_t *local_48;
  uint *local_40;
  int *local_38;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar4 = malloc(400);
  *(void **)(__ptr + 2) = pvVar4;
  pMVar5 = (Min_Cube_t *)Extra_MmFixedEntryFetch(p->pMemMan);
  pMVar5->pNext = (Min_Cube_t *)0x0;
  uVar10 = p->nVars & 0x3ff;
  *(uint *)&pMVar5->field_0x8 = *(uint *)&pMVar5->field_0x8 & 0xfffffc00 | uVar10;
  *(uint *)&pMVar5->field_0x8 = (p->nWords & 0xfffU) << 10 | uVar10;
  memset(pMVar5->uData,0xff,(long)p->nWords << 2);
  local_58._0_8_ = pMVar5;
  if (pSharp != (Min_Cube_t *)0x0) {
    do {
      if ((Min_Cube_t *)local_58._0_8_ != (Min_Cube_t *)0x0) {
        pMVar5 = (Min_Cube_t *)local_58;
        pMVar6 = (Min_Cube_t *)local_58._0_8_;
        local_58._8_8_ = pSharp;
        do {
          uVar10 = *(uint *)&pSharp->field_0x8;
          if (((uVar10 ^ *(uint *)&pMVar6->field_0x8) & 0x3ff) != 0) {
            __assert_fail("pCube0->nVars == pCube1->nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covInt.h"
                          ,299,"int Min_CubesDisjoint(Min_Cube_t *, Min_Cube_t *)");
          }
          uVar8 = *(uint *)&pMVar6->field_0x8 >> 10 & 0xfff;
          if (uVar8 != 0) {
            uVar9 = 0;
            do {
              uVar11 = pSharp->uData[uVar9] & pMVar6->uData[uVar9];
              if ((~(uVar11 >> 1 | uVar11) & 0x55555555) != 0) {
                pMVar7 = pMVar6->pNext;
                pMVar5 = pMVar6;
                goto LAB_0044e077;
              }
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
          }
          local_48 = pMVar6->pNext;
          __ptr[1] = 0;
          if ((uVar10 & 0x3ffc00) != 0) {
            iVar12 = 0;
            uVar9 = 0;
            do {
              uVar8 = pMVar6->uData[uVar9] >> 1 & pMVar6->uData[uVar9] &
                      (pSharp->uData[uVar9] >> 1 ^ pSharp->uData[uVar9]) & 0x55555555;
              if (uVar8 != 0) {
                uVar10 = 0xfffffffe;
                iVar16 = iVar12;
                do {
                  if ((uVar8 >> (uVar10 + 2 & 0x1f) & 1) != 0) {
                    uVar11 = __ptr[1];
                    if (uVar11 == *__ptr) {
                      if ((int)uVar11 < 0x10) {
                        if (*(void **)(__ptr + 2) == (void *)0x0) {
                          pvVar4 = malloc(0x40);
                        }
                        else {
                          pvVar4 = realloc(*(void **)(__ptr + 2),0x40);
                        }
                        *(void **)(__ptr + 2) = pvVar4;
                        if (pvVar4 == (void *)0x0) {
LAB_0044e18a:
                          __assert_fail("p->pArray",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                        }
                        *__ptr = 0x10;
                      }
                      else {
                        if (*(void **)(__ptr + 2) == (void *)0x0) {
                          pvVar4 = malloc((ulong)uVar11 * 8);
                        }
                        else {
                          pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar11 * 8);
                        }
                        *(void **)(__ptr + 2) = pvVar4;
                        if (pvVar4 == (void *)0x0) goto LAB_0044e18a;
                        *__ptr = uVar11 * 2;
                      }
                    }
                    else {
                      pvVar4 = *(void **)(__ptr + 2);
                    }
                    __ptr[1] = uVar11 + 1;
                    *(int *)((long)pvVar4 + (long)(int)uVar11 * 4) = iVar16;
                  }
                  uVar10 = uVar10 + 2;
                  iVar16 = iVar16 + 1;
                } while (uVar10 < 0x1e);
                uVar10 = *(uint *)(local_58._8_8_ + 8);
                pSharp = (Min_Cube_t *)local_58._8_8_;
              }
              uVar9 = uVar9 + 1;
              iVar12 = iVar12 + 0x10;
            } while (uVar9 < (uVar10 >> 10 & 0xfff));
            lVar15 = (long)(int)__ptr[1];
            if (0 < lVar15) {
              lVar1 = *(long *)(__ptr + 2);
              iVar12 = *(int *)(lVar1 + -4 + lVar15 * 4);
              lVar13 = lVar15 + -1;
              pMVar6->uData[iVar12 >> 4] =
                   pMVar6->uData[iVar12 >> 4] ^ 3 << ((char)iVar12 * '\x02' & 0x1fU);
              if (lVar13 != 0) {
                lVar1 = lVar1 + lVar15 * 4;
                __s = pMVar6->uData;
                pMVar7 = pMVar6;
                do {
                  local_38 = (int *)(lVar1 + -4);
                  iVar12 = *local_38;
                  uVar10 = __s[iVar12 >> 4];
                  local_40 = __s;
                  pMVar6 = (Min_Cube_t *)Extra_MmFixedEntryFetch(p->pMemMan);
                  pMVar6->pNext = (Min_Cube_t *)0x0;
                  uVar8 = p->nVars & 0x3ff;
                  *(uint *)&pMVar6->field_0x8 = *(uint *)&pMVar6->field_0x8 & 0xfffffc00 | uVar8;
                  uVar8 = (p->nWords & 0xfffU) << 10 | uVar8;
                  *(uint *)&pMVar6->field_0x8 = uVar8;
                  __s = pMVar6->uData;
                  memset(__s,0xff,(long)p->nWords << 2);
                  memcpy(__s,local_40,(long)p->nWords << 2);
                  *(uint *)&pMVar6->field_0x8 = *(uint *)&pMVar7->field_0x8 & 0xffc00000 | uVar8;
                  pMVar6->uData[*local_38 >> 4] =
                       pMVar6->uData[*local_38 >> 4] ^
                       (~(uVar10 >> ((char)iVar12 * '\x02' & 0x1fU)) & 3) <<
                       ((char)*local_38 * '\x02' & 0x1fU);
                  pMVar5->pNext = pMVar6;
                  iVar12 = *(int *)(*(long *)(__ptr + 2) + -8 + lVar15 * 4);
                  lVar1 = *(long *)(__ptr + 2) + lVar13 * 4;
                  lVar13 = lVar13 + -1;
                  pMVar6->uData[iVar12 >> 4] =
                       pMVar6->uData[iVar12 >> 4] ^ 3 << ((char)iVar12 * '\x02' & 0x1fU);
                  lVar15 = lVar15 + -1;
                  pMVar5 = pMVar6;
                  pMVar7 = pMVar6;
                } while (lVar15 != 1);
              }
            }
          }
          pMVar6->pNext = local_48;
          pMVar7 = local_48;
          pSharp = (Min_Cube_t *)local_58._8_8_;
          pMVar5 = pMVar6;
LAB_0044e077:
          pMVar6 = pMVar7;
        } while (pMVar7 != (Min_Cube_t *)0x0);
      }
      pSharp = pSharp->pNext;
    } while (pSharp != (Min_Cube_t *)0x0);
    pvVar4 = *(void **)(__ptr + 2);
  }
  if (pvVar4 != (void *)0x0) {
    free(pvVar4);
  }
  free(__ptr);
  pMVar5 = (Min_Cube_t *)local_58._0_8_;
  if ((Min_Cube_t *)local_58._0_8_ == (Min_Cube_t *)0x0) {
    Min_ManClean(p,p->nVars);
  }
  else {
    Min_ManClean(p,*(uint *)(local_58._0_8_ + 8) & 0x3ff);
    do {
      pMVar6 = pMVar5->pNext;
      ppMVar2 = p->ppStore;
      uVar10 = *(uint *)&pMVar5->field_0x8 >> 0x16;
      pMVar7 = ppMVar2[uVar10];
      if (pMVar7 == (Min_Cube_t *)0x0) {
LAB_0044e126:
        pMVar5->pNext = pMVar7;
        ppMVar2[uVar10] = pMVar5;
        p->nCubes = p->nCubes + 1;
      }
      else {
        uVar8 = *(uint *)&pMVar5->field_0x8 >> 10 & 0xfff;
        pMVar14 = pMVar7;
        if (uVar8 != 0) {
          do {
            uVar9 = 0;
            while (pMVar5->uData[uVar9] == pMVar14->uData[uVar9]) {
              uVar9 = uVar9 + 1;
              if (uVar8 == uVar9) goto LAB_0044e137;
            }
            ppMVar3 = &pMVar14->pNext;
            pMVar14 = *ppMVar3;
          } while (*ppMVar3 != (Min_Cube_t *)0x0);
          goto LAB_0044e126;
        }
LAB_0044e137:
        Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pMVar5);
      }
      pMVar5 = pMVar6;
    } while (pMVar6 != (Min_Cube_t *)0x0);
  }
  Min_SopDist1Merge(p);
  Min_SopContain(p);
  pMVar5 = Min_CoverCollect(p,p->nVars);
  return pMVar5;
}

Assistant:

Min_Cube_t * Min_SopComplement( Min_Man_t * p, Min_Cube_t * pSharp )
{
     Vec_Int_t * vVars;
     Min_Cube_t * pCover, * pCube, * pNext, * pReady, * pThis, ** ppPrev;
     int Num, Value, i;

     // get the variables
     vVars = Vec_IntAlloc( 100 );
    // create the tautology cube
     pCover = Min_CubeAlloc( p );
     // sharp it with all cubes
     Min_CoverForEachCube( pSharp, pCube )
     Min_CoverForEachCubePrev( pCover, pThis, ppPrev )
     {
        if ( Min_CubesDisjoint( pThis, pCube ) )
            continue;
        // remember the next pointer
        pNext = pThis->pNext;
        // get the variables, in which pThis is '-' while pCube is fixed
        Min_CoverGetDisjVars( pThis, pCube, vVars );
        // generate the disjoint cubes
        pReady = pThis;
        Vec_IntForEachEntryReverse( vVars, Num, i )
        {
            // correct the literal
            Min_CubeXorVar( pReady, vVars->pArray[i], 3 );
            if ( i == 0 )
                break;
            // create the new cube and clean this value
            Value = Min_CubeGetVar( pReady, vVars->pArray[i] );
            pReady = Min_CubeDup( p, pReady );
            Min_CubeXorVar( pReady, vVars->pArray[i], 3 ^ Value );
            // add to the cover
            *ppPrev = pReady;
            ppPrev = &pReady->pNext;
        }
        pThis = pReady;
        pThis->pNext = pNext;
     }
     Vec_IntFree( vVars );

     // perform dist-1 merge and contain
     Min_CoverExpandRemoveEqual( p, pCover );
     Min_SopDist1Merge( p );
     Min_SopContain( p );
     return Min_CoverCollect( p, p->nVars );
}